

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[30],kj::StringPtr&,char_const(&)[365],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[348]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [7],
          StringPtr *params_2,char (*params_3) [30],StringPtr *params_4,char (*params_5) [365],
          StringTree *params_6,StringTree *params_7,Array<kj::StringTree> *params_8,
          char (*params_9) [348])

{
  StringTree *pSVar1;
  char (*value) [7];
  StringPtr *pSVar2;
  char (*value_00) [30];
  char (*value_01) [365];
  StringTree *pSVar3;
  StringTree *pSVar4;
  Array<kj::StringTree> *this_00;
  char (*value_02) [348];
  Array<kj::StringTree> *value_03;
  ArrayPtr<const_char> *in_stack_fffffffffffffee0;
  ArrayPtr<const_char> local_d0;
  StringTree local_c0;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  StringPtr *params_local_4;
  char (*params_local_3) [30];
  StringPtr *params_local_2;
  char (*params_local_1) [7];
  StringTree *params_local;
  
  local_38 = (StringPtr *)params_3;
  params_local_4 = params_2;
  params_local_3 = (char (*) [30])params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (char (*) [7])this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = ::const((char (*) [7])params_local_2);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[7]>(value);
  pSVar2 = fwd<kj::StringPtr&>((StringPtr *)params_local_3);
  local_58 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar2);
  value_00 = ::const((char (*) [30])params_local_4);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[30]>(value_00);
  pSVar2 = fwd<kj::StringPtr&>(local_38);
  local_78 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar2);
  value_01 = ::const((char (*) [365])params_4);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[365]>(value_01);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_5);
  pSVar3 = _::toStringTreeOrCharSequence(pSVar3);
  pSVar4 = fwd<kj::StringTree>(params_6);
  pSVar4 = _::toStringTreeOrCharSequence(pSVar4);
  this_00 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_7);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_c0,(_ *)this_00,value_03);
  value_02 = ::const((char (*) [348])params_8);
  local_d0 = _::toStringTreeOrCharSequence<char_const(&)[348]>(value_02);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pSVar1,(StringTree *)&local_48,&local_58,&local_68,&local_78,
             &local_88,(ArrayPtr<const_char> *)pSVar3,pSVar4,&local_c0,(StringTree *)&local_d0,
             in_stack_fffffffffffffee0);
  StringTree::~StringTree(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}